

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_remote_port(Curl_easy *data,connectdata *conn)

{
  long lVar1;
  unsigned_short uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  char endbracket;
  char type [12];
  
  iVar3 = __isoc99_sscanf((conn->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",&endbracket);
  if ((iVar3 == 1) && (endbracket == ']')) {
    (conn->bits).ipv6_ip = true;
    pcVar6 = (conn->host).name + 1;
    (conn->host).name = pcVar6;
    pcVar4 = strchr(pcVar6,0x5d);
    if (pcVar4 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      *pcVar4 = '\0';
      pcVar6 = (char *)0x0;
      if (pcVar4[1] == ':') {
        pcVar6 = pcVar4 + 1;
      }
    }
  }
  else {
    pcVar6 = strchr((conn->host).name,0x3a);
  }
  lVar1 = (data->set).use_port;
  if ((lVar1 == 0) || ((data->state).allow_port != true)) {
    if (pcVar6 != (char *)0x0) {
      uVar5 = strtol(pcVar6 + 1,(char **)type,10);
      if (uVar5 < 0x10000) {
        if (*(char *)type._0_8_ == '\0') {
          *pcVar6 = '\0';
          if ((char *)type._0_8_ != pcVar6 + 1) {
            uVar2 = curlx_ultous(uVar5);
            conn->remote_port = (uint)uVar2;
          }
          goto LAB_00570df3;
        }
        Curl_failf(data,"Port number ended with \'%c\'");
      }
      else {
        Curl_failf(data,"Port number out of range");
      }
      return CURLE_URL_MALFORMAT;
    }
  }
  else {
    conn->remote_port = (uint)lVar1 & 0xffff;
    if (pcVar6 != (char *)0x0) {
      *pcVar6 = '\0';
    }
    if ((conn->bits).httpproxy == true) {
      type[8] = '\0';
      type[9] = '\0';
      type[10] = '\0';
      type[0xb] = '\0';
      type[0] = '\0';
      type[1] = '\0';
      type[2] = '\0';
      type[3] = '\0';
      type[4] = '\0';
      type[5] = '\0';
      type[6] = '\0';
      type[7] = '\0';
      if ((conn->bits).type_set == true) {
        uVar5 = 0x41;
        if ((data->set).prefer_ascii == false) {
          uVar5 = (ulong)(((data->set).ftp_list_only ^ 1) * 5 + 0x44);
        }
        curl_msnprintf(type,0xc,";type=%c",uVar5);
      }
      pcVar6 = "[";
      bVar8 = (conn->bits).ipv6_ip == false;
      if (bVar8) {
        pcVar6 = "";
      }
      pcVar4 = "]";
      if (bVar8) {
        pcVar4 = "";
      }
      pcVar7 = "/";
      if ((data->state).slash_removed == false) {
        pcVar7 = "";
      }
      pcVar6 = curl_maprintf("%s://%s%s%s:%hu%s%s%s",conn->given->scheme,pcVar6,(conn->host).name,
                             pcVar4,(ulong)(uint)conn->remote_port,pcVar7,(data->state).path,type);
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
        (data->change).url = (char *)0x0;
        (data->change).url_alloc = false;
      }
      (data->change).url = pcVar6;
      (data->change).url_alloc = true;
    }
  }
LAB_00570df3:
  if (conn->remote_port < 0) {
    conn->remote_port = (uint)(ushort)conn->given->defport;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode parse_remote_port(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  char *portptr;
  char endbracket;

  /* Note that at this point, the IPv6 address cannot contain any scope
     suffix as that has already been removed in the parseurlandfillconn()
     function */
  if((1 == sscanf(conn->host.name, "[%*45[0123456789abcdefABCDEF:.]%c",
                  &endbracket)) &&
     (']' == endbracket)) {
    /* this is a RFC2732-style specified IP-address */
    conn->bits.ipv6_ip = TRUE;

    conn->host.name++; /* skip over the starting bracket */
    portptr = strchr(conn->host.name, ']');
    if(portptr) {
      *portptr++ = '\0'; /* zero terminate, killing the bracket */
      if(':' != *portptr)
        portptr = NULL; /* no port number available */
    }
  }
  else {
#ifdef ENABLE_IPV6
    struct in6_addr in6;
    if(Curl_inet_pton(AF_INET6, conn->host.name, &in6) > 0) {
      /* This is a numerical IPv6 address, meaning this is a wrongly formatted
         URL */
      failf(data, "IPv6 numerical address used in URL without brackets");
      return CURLE_URL_MALFORMAT;
    }
#endif

    portptr = strchr(conn->host.name, ':');
  }

  if(data->set.use_port && data->state.allow_port) {
    /* if set, we use this and ignore the port possibly given in the URL */
    conn->remote_port = (unsigned short)data->set.use_port;
    if(portptr)
      *portptr = '\0'; /* cut off the name there anyway - if there was a port
                      number - since the port number is to be ignored! */
    if(conn->bits.httpproxy) {
      /* we need to create new URL with the new port number */
      char *url;
      char type[12]="";

      if(conn->bits.type_set)
        snprintf(type, sizeof(type), ";type=%c",
                 data->set.prefer_ascii?'A':
                 (data->set.ftp_list_only?'D':'I'));

      /*
       * This synthesized URL isn't always right--suffixes like ;type=A are
       * stripped off. It would be better to work directly from the original
       * URL and simply replace the port part of it.
       */
      url = aprintf("%s://%s%s%s:%hu%s%s%s", conn->given->scheme,
                    conn->bits.ipv6_ip?"[":"", conn->host.name,
                    conn->bits.ipv6_ip?"]":"", conn->remote_port,
                    data->state.slash_removed?"/":"", data->state.path,
                    type);
      if(!url)
        return CURLE_OUT_OF_MEMORY;

      if(data->change.url_alloc) {
        Curl_safefree(data->change.url);
        data->change.url_alloc = FALSE;
      }

      data->change.url = url;
      data->change.url_alloc = TRUE;
    }
  }
  else if(portptr) {
    /* no CURLOPT_PORT given, extract the one from the URL */

    char *rest;
    long port;

    port=strtol(portptr+1, &rest, 10);  /* Port number must be decimal */

    if((port < 0) || (port > 0xffff)) {
      /* Single unix standard says port numbers are 16 bits long */
      failf(data, "Port number out of range");
      return CURLE_URL_MALFORMAT;
    }

    if(rest[0]) {
      failf(data, "Port number ended with '%c'", rest[0]);
      return CURLE_URL_MALFORMAT;
    }

    if(rest != &portptr[1]) {
      *portptr = '\0'; /* cut off the name there */
      conn->remote_port = curlx_ultous(port);
    }
    else {
      /* Browser behavior adaptation. If there's a colon with no digits after,
         just cut off the name there which makes us ignore the colon and just
         use the default port. Firefox and Chrome both do that. */
      *portptr = '\0';
    }
  }

  /* only if remote_port was not already parsed off the URL we use the
     default port number */
  if(conn->remote_port < 0)
    conn->remote_port = (unsigned short)conn->given->defport;

  return CURLE_OK;
}